

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O3

istream * amrex::operator>>(istream *is,expect *exp)

{
  ulong uVar1;
  long *plVar2;
  long *plVar3;
  uint uVar4;
  ulong uVar5;
  char c;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = (exp->istr)._M_string_length;
  uVar4 = (uint)uVar1;
  if ((int)uVar4 < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      std::operator>>(is,(char *)&local_70);
      if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) goto LAB_0051f94d;
      if ((char)local_70 != (exp->istr)._M_dataplus._M_p[uVar5]) {
        std::istream::putback((char)is);
        uVar5 = uVar5 + 1;
        goto LAB_0051f94d;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
    uVar5 = uVar1 & 0xffffffff;
  }
LAB_0051f94d:
  if ((uint)uVar5 != uVar4) {
    std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
    std::operator+(&local_50,"expect fails to find \"",&exp->istr);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Error_host((char *)local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
  }
  return is;
}

Assistant:

std::istream&
amrex::operator>>(std::istream& is, const expect& exp)
{
    int len = exp.istr.size();
    int n = 0;
    while ( n < len )
    {
        char c;
        is >> c;
        if ( !is ) break;
        if ( c != exp.istr[n++] )
        {
            is.putback(c);
            break;
        }
    }
    if ( n != len )
    {
        is.clear(std::ios::badbit|is.rdstate());
        std::string msg = "expect fails to find \"" + exp.the_string() + "\"";
        amrex::Error(msg.c_str());
    }
    return is;
}